

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator fmt::v5::
         vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>
                   (range out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                   args,locale_ref loc)

{
  basic_string_view<char> str;
  locale_ref in_RCX;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined1 in_SIL;
  char *in_RDI;
  iterator iVar1;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  h;
  undefined1 in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed1;
  basic_string_view<char> in_stack_fffffffffffffed8;
  range in_stack_ffffffffffffff38;
  basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  in_stack_ffffffffffffff50;
  undefined7 uStack_17;
  
  str.size_._1_7_ = uStack_17;
  str.size_._0_1_ = in_SIL;
  str.data_ = in_RDI;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  ::format_handler(in_RDX,in_stack_ffffffffffffff38,str,in_stack_ffffffffffffff50,in_RCX);
  internal::
  parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>&>
            (in_stack_fffffffffffffed8,
             (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
              *)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0));
  iVar1 = internal::
          context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
          ::out((context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                 *)&stack0xffffffffffffff40);
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  ::~format_handler((format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                     *)0x287834);
  iVar1._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  return iVar1;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::range out,
    basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    internal::locale_ref loc = internal::locale_ref()) {
  format_handler<ArgFormatter, Char, Context> h(out, format_str, args, loc);
  internal::parse_format_string<false>(format_str, h);
  return h.context.out();
}